

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_cloud_kd_tree_decoder.cc
# Opt level: O1

bool __thiscall
draco::PointCloudKdTreeDecoder::CreateAttributesDecoder
          (PointCloudKdTreeDecoder *this,int32_t att_decoder_id)

{
  bool bVar1;
  tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  this_00;
  __uniq_ptr_impl<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
  local_20;
  
  this_00.
  super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        )operator_new(0x90);
  KdTreeAttributesDecoder::KdTreeAttributesDecoder
            ((KdTreeAttributesDecoder *)
             this_00.
             super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
             .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl);
  local_20._M_t.
  super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
  .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl =
       (tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        )(tuple<draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
          )this_00.
           super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
           .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl;
  bVar1 = PointCloudDecoder::SetAttributesDecoder
                    (&this->super_PointCloudDecoder,att_decoder_id,
                     (unique_ptr<draco::AttributesDecoderInterface,_std::default_delete<draco::AttributesDecoderInterface>_>
                      *)&local_20);
  if ((_Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
       )local_20._M_t.
        super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
        .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>._M_head_impl !=
      (AttributesDecoderInterface *)0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_draco::AttributesDecoderInterface_*,_std::default_delete<draco::AttributesDecoderInterface>_>
                          .super__Head_base<0UL,_draco::AttributesDecoderInterface_*,_false>.
                          _M_head_impl + 8))();
  }
  return bVar1;
}

Assistant:

bool PointCloudKdTreeDecoder::CreateAttributesDecoder(int32_t att_decoder_id) {
  // Always create the basic attribute decoder.
  return SetAttributesDecoder(
      att_decoder_id,
      std::unique_ptr<AttributesDecoder>(new KdTreeAttributesDecoder()));
}